

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O0

size_t Lodtalk::variableSlotSizeFor(ObjectFormat format)

{
  size_t sStack_10;
  ObjectFormat format_local;
  
  switch(format) {
  case OF_EMPTY:
  case OF_FIXED_SIZE:
    sStack_10 = 0;
    break;
  case OF_VARIABLE_SIZE_NO_IVARS:
  case OF_VARIABLE_SIZE_IVARS:
  case OF_WEAK_VARIABLE_SIZE:
    sStack_10 = 8;
    break;
  case OF_WEAK_FIXED_SIZE:
    sStack_10 = 0;
    break;
  default:
    abort();
  case OF_INDEXABLE_64:
    sStack_10 = 8;
    break;
  case OF_INDEXABLE_32:
  case OF_INDEXABLE_32_1:
    sStack_10 = 4;
    break;
  case OF_INDEXABLE_16:
  case OF_INDEXABLE_16_1:
  case OF_INDEXABLE_16_2:
  case OF_INDEXABLE_16_3:
    sStack_10 = 2;
    break;
  case OF_INDEXABLE_8:
  case OF_INDEXABLE_8_1:
  case OF_INDEXABLE_8_2:
  case OF_INDEXABLE_8_3:
  case OF_INDEXABLE_8_4:
  case OF_INDEXABLE_8_5:
  case OF_INDEXABLE_8_6:
  case OF_INDEXABLE_8_7:
  case OF_COMPILED_METHOD:
  case OF_COMPILED_METHOD_1:
  case OF_COMPILED_METHOD_2:
  case OF_COMPILED_METHOD_3:
  case OF_COMPILED_METHOD_4:
  case OF_COMPILED_METHOD_5:
  case OF_COMPILED_METHOD_6:
  case OF_COMPILED_METHOD_7:
    sStack_10 = 1;
  }
  return sStack_10;
}

Assistant:

inline size_t variableSlotSizeFor(ObjectFormat format)
{
	switch(format)
	{
	case OF_EMPTY:
	case OF_FIXED_SIZE:
		return 0;
	case OF_VARIABLE_SIZE_NO_IVARS:
	case OF_VARIABLE_SIZE_IVARS:
	case OF_WEAK_VARIABLE_SIZE:
		return sizeof(void*);
	case OF_WEAK_FIXED_SIZE:
		return 0;
	case OF_INDEXABLE_64:
		return 8;
	case OF_INDEXABLE_32:
	case OF_INDEXABLE_32_1:
		return 4;
	case OF_INDEXABLE_16:
	case OF_INDEXABLE_16_1:
	case OF_INDEXABLE_16_2:
	case OF_INDEXABLE_16_3:
		return 2;
	case OF_INDEXABLE_8:
	case OF_INDEXABLE_8_1:
	case OF_INDEXABLE_8_2:
	case OF_INDEXABLE_8_3:
	case OF_INDEXABLE_8_4:
	case OF_INDEXABLE_8_5:
	case OF_INDEXABLE_8_6:
	case OF_INDEXABLE_8_7:
	case OF_COMPILED_METHOD:
	case OF_COMPILED_METHOD_1:
	case OF_COMPILED_METHOD_2:
	case OF_COMPILED_METHOD_3:
	case OF_COMPILED_METHOD_4:
	case OF_COMPILED_METHOD_5:
	case OF_COMPILED_METHOD_6:
	case OF_COMPILED_METHOD_7:
		return 1;
	default: abort();
	}
}